

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_drbg.c
# Opt level: O0

int mbedtls_hmac_drbg_seed_buf
              (mbedtls_hmac_drbg_context *ctx,mbedtls_md_info_t *md_info,uchar *data,size_t data_len
              )

{
  byte bVar1;
  int ret;
  size_t data_len_local;
  uchar *data_local;
  mbedtls_md_info_t *md_info_local;
  mbedtls_hmac_drbg_context *ctx_local;
  
  ctx_local._4_4_ = mbedtls_md_setup(&ctx->md_ctx,md_info,1);
  if (ctx_local._4_4_ == 0) {
    bVar1 = mbedtls_md_get_size(md_info);
    ctx_local._4_4_ = mbedtls_md_hmac_starts(&ctx->md_ctx,ctx->V,(ulong)bVar1);
    if (ctx_local._4_4_ == 0) {
      bVar1 = mbedtls_md_get_size(md_info);
      memset(ctx->V,1,(ulong)bVar1);
      ctx_local._4_4_ = mbedtls_hmac_drbg_update(ctx,data,data_len);
      if (ctx_local._4_4_ == 0) {
        ctx_local._4_4_ = 0;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_hmac_drbg_seed_buf(mbedtls_hmac_drbg_context *ctx,
                               const mbedtls_md_info_t *md_info,
                               const unsigned char *data, size_t data_len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if ((ret = mbedtls_md_setup(&ctx->md_ctx, md_info, 1)) != 0) {
        return ret;
    }

#if defined(MBEDTLS_THREADING_C)
    mbedtls_mutex_init(&ctx->mutex);
#endif

    /*
     * Set initial working state.
     * Use the V memory location, which is currently all 0, to initialize the
     * MD context with an all-zero key. Then set V to its initial value.
     */
    if ((ret = mbedtls_md_hmac_starts(&ctx->md_ctx, ctx->V,
                                      mbedtls_md_get_size(md_info))) != 0) {
        return ret;
    }
    memset(ctx->V, 0x01, mbedtls_md_get_size(md_info));

    if ((ret = mbedtls_hmac_drbg_update(ctx, data, data_len)) != 0) {
        return ret;
    }

    return 0;
}